

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall capnp::_::RpcSystemBase::Impl::~Impl(Impl *this)

{
  anon_class_8_1_8991fb9c_for_func local_18;
  
  local_18.this = this;
  kj::UnwindDetector::
  catchExceptionsIfUnwinding<capnp::_::RpcSystemBase::Impl::~Impl()::_lambda()_1_>
            (&this->unwindDetector,&local_18);
  std::
  unordered_map<capnp::_::VatNetworkBase::Connection_*,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>,_std::hash<capnp::_::VatNetworkBase::Connection_*>,_std::equal_to<capnp::_::VatNetworkBase::Connection_*>,_std::allocator<std::pair<capnp::_::VatNetworkBase::Connection_*const,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_>_>_>
  ::~unordered_map(&this->connections);
  kj::TaskSet::~TaskSet(&this->tasks);
  kj::_::
  NullableValue<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  ::~NullableValue(&(this->gateway).ptr);
  kj::_::NullableValue<capnp::Capability::Client>::~NullableValue(&(this->bootstrapInterface).ptr);
  return;
}

Assistant:

~Impl() noexcept(false) {
    unwindDetector.catchExceptionsIfUnwinding([&]() {
      // std::unordered_map doesn't like it when elements' destructors throw, so carefully
      // disassemble it.
      if (!connections.empty()) {
        kj::Vector<kj::Own<RpcConnectionState>> deleteMe(connections.size());
        kj::Exception shutdownException = KJ_EXCEPTION(FAILED, "RpcSystem was destroyed.");
        for (auto& entry: connections) {
          entry.second->disconnect(kj::cp(shutdownException));
          deleteMe.add(kj::mv(entry.second));
        }
      }
    });
  }